

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

void __thiscall
simple_thread_pool::ThreadPoolMgr::registerThreadId
          (ThreadPoolMgr *this,shared_ptr<simple_thread_pool::ThreadHandle> *t_handle)

{
  value_type *in_RDI;
  lock_guard<std::mutex> l;
  id tid;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>
  *in_stack_ffffffffffffff90;
  value_type *this_00;
  
  std::this_thread::get_id();
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  this_00 = in_RDI + 0x10;
  std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>::
  pair<std::thread::id_&,_true>
            (in_stack_ffffffffffffff90,
             (id *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             (shared_ptr<simple_thread_pool::ThreadHandle> *)0x10c1ac);
  std::
  unordered_map<std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
  ::insert((unordered_map<std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
            *)this_00,in_RDI);
  std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>::~pair
            ((pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_> *)
             0x10c1e4);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10c1ee);
  return;
}

Assistant:

void registerThreadId(const std::shared_ptr<ThreadHandle>& t_handle) {
        std::thread::id tid = std::this_thread::get_id();

        std::lock_guard<std::mutex> l(threadIdsLock);
        threadIds.insert({tid, t_handle});
    }